

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<const_kj::ReadableFile> __thiscall
kj::ReadableDirectory::openFile(ReadableDirectory *this,PathPtr path)

{
  Own<const_kj::ReadableFile> *pOVar1;
  Clock *clock;
  undefined8 in_RCX;
  ReadableFile *extraout_RDX;
  Own<const_kj::ReadableFile> OVar2;
  Own<kj::File> local_80;
  Fault local_70;
  Fault f;
  Maybe<kj::Own<const_kj::ReadableFile>_> local_48;
  undefined1 local_38 [8];
  OwnOwn<const_kj::ReadableFile> file;
  ReadableDirectory *this_local;
  PathPtr path_local;
  
  this_local = (ReadableDirectory *)path.parts.size_;
  file.value.ptr = (ReadableFile *)path.parts.ptr;
  path_local.parts.size_ = (size_t)this;
  (**(code **)((((String *)file.value.ptr)->content).ptr + 0x50))
            (&local_48,file.value.ptr,this_local,in_RCX);
  _::readMaybe<kj::ReadableFile_const>((_ *)local_38,&local_48);
  Maybe<kj::Own<const_kj::ReadableFile>_>::~Maybe(&local_48);
  pOVar1 = _::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_38);
  if (pOVar1 == (Own<const_kj::ReadableFile> *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18],kj::PathPtr&>
              (&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x227,FAILED,(char *)0x0,"\"no such directory\", path",
               (char (*) [18])"no such directory",(PathPtr *)&this_local);
    f.exception._0_4_ = 2;
    _::Debug::Fault::~Fault(&local_70);
    clock = nullClock();
    newInMemoryFile((kj *)&local_80,clock);
    Own<kj::ReadableFile_const>::Own<kj::File,void>((Own<kj::ReadableFile_const> *)this,&local_80);
    Own<kj::File>::~Own(&local_80);
  }
  else {
    pOVar1 = _::OwnOwn<const_kj::ReadableFile>::operator*
                       ((OwnOwn<const_kj::ReadableFile> *)local_38);
    pOVar1 = mv<kj::Own<kj::ReadableFile_const>>(pOVar1);
    Own<const_kj::ReadableFile>::Own((Own<const_kj::ReadableFile> *)this,pOVar1);
  }
  f.exception._0_4_ = 1;
  _::OwnOwn<const_kj::ReadableFile>::~OwnOwn((OwnOwn<const_kj::ReadableFile> *)local_38);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<const ReadableFile> ReadableDirectory::openFile(PathPtr path) const {
  KJ_IF_MAYBE(file, tryOpenFile(path)) {
    return kj::mv(*file);
  } else {
    KJ_FAIL_REQUIRE("no such directory", path) { break; }